

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O3

void __thiscall
QAbstractItemModelTesterPrivate::headerDataChanged
          (QAbstractItemModelTesterPrivate *this,Orientation orientation,int start,int end)

{
  QObject *pQVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  long in_FS_OFFSET;
  undefined4 local_58 [2];
  undefined8 local_50 [2];
  undefined4 local_40 [2];
  undefined8 local_38 [2];
  long local_28;
  
  puVar6 = local_58;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = verify(this,(EVP_PKEY_CTX *)(ulong)((uint)~start >> 0x1f),(uchar *)"start >= 0",0x157a73,
                 (uchar *)
                 "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                 ,0x3f2);
  if ((char)iVar2 != '\0') {
    iVar2 = verify(this,(EVP_PKEY_CTX *)(ulong)((uint)~end >> 0x1f),(uchar *)"end >= 0",0x157a73,
                   (uchar *)
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x3f3);
    if ((char)iVar2 != '\0') {
      iVar2 = verify(this,(EVP_PKEY_CTX *)(ulong)(start <= end),(uchar *)"start <= end",0x157a73,
                     (uchar *)
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x3f4);
      if ((char)iVar2 != '\0') {
        pQVar1 = (this->model).wp.value;
        if (orientation == Vertical) {
          puVar5 = local_38;
          local_40[0] = 0xffffffff;
          lVar4 = 0x78;
          puVar6 = local_40;
        }
        else {
          puVar5 = local_50;
          local_58[0] = 0xffffffff;
          lVar4 = 0x80;
        }
        puVar6[1] = 0xffffffff;
        *puVar5 = 0;
        puVar5[1] = 0;
        iVar2 = (**(code **)(*(long *)pQVar1 + lVar4))();
        iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)(start < iVar2),(uchar *)"start < itemCount",
                       0x157a73,(uchar *)
                                "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                       ,0x3f6);
        if ((char)iVar3 != '\0') {
          verify(this,(EVP_PKEY_CTX *)(ulong)(end < iVar2),(uchar *)"end < itemCount",0x157a73,
                 (uchar *)
                 "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                 ,0x3f7);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::headerDataChanged(Qt::Orientation orientation, int start, int end)
{
    MODELTESTER_VERIFY(start >= 0);
    MODELTESTER_VERIFY(end >= 0);
    MODELTESTER_VERIFY(start <= end);
    int itemCount = orientation == Qt::Vertical ? model->rowCount() : model->columnCount();
    MODELTESTER_VERIFY(start < itemCount);
    MODELTESTER_VERIFY(end < itemCount);
}